

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.h
# Opt level: O2

void __thiscall CVmObjFrameRef::make_snapshot(CVmObjFrameRef *this)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  plVar3 = (long *)*plVar1;
  plVar4 = plVar1 + 0xb;
  plVar6 = plVar3;
  for (lVar5 = 0; lVar5 < (int)plVar1[4]; lVar5 = lVar5 + 1) {
    lVar2 = plVar6[1];
    *plVar4 = *plVar6;
    plVar4[1] = lVar2;
    plVar4 = plVar4 + 2;
    plVar6 = plVar6 + 2;
  }
  plVar3 = plVar3 + -0x18;
  for (lVar5 = 0; lVar5 < *(int *)((long)plVar1 + 0x24); lVar5 = lVar5 + 1) {
    lVar2 = plVar3[1];
    *plVar4 = *plVar3;
    plVar4[1] = lVar2;
    plVar4 = plVar4 + 2;
    plVar3 = plVar3 + -2;
  }
  return;
}

Assistant:

vm_frameref_ext *get_ext() const { return (vm_frameref_ext *)ext_; }